

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

void __thiscall stick::Error::Error(Error *this,Int32 _code,ErrorCategory *_category)

{
  DefaultAllocator *pDVar1;
  
  this->m_category = _category;
  this->m_code = _code;
  if (defaultAllocator()::m_def == '\0') {
    stick::Error();
  }
  pDVar1 = defaultAllocator::m_def;
  (this->m_message).m_cStr = (char *)0x0;
  (this->m_message).m_length = 0;
  (this->m_message).m_capacity = 0;
  (this->m_message).m_allocator = &pDVar1->super_Allocator;
  if (defaultAllocator()::m_def == '\0') {
    stick::Error();
  }
  pDVar1 = defaultAllocator::m_def;
  (this->m_file).m_cStr = (char *)0x0;
  (this->m_file).m_length = 0;
  (this->m_file).m_capacity = 0;
  (this->m_file).m_allocator = &pDVar1->super_Allocator;
  return;
}

Assistant:

Error::Error(Int32 _code, const ErrorCategory & _category) : m_category(&_category), m_code(_code)
{
}